

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockTime.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,ClockTime *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  ClockTime *local_18;
  ClockTime *this_local;
  
  local_18 = this;
  this_local = (ClockTime *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Hour:             ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i32Hour);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Time Past Hour:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32TimePastHour);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ClockTime::GetAsString() const
{
    KStringStream ss;

    ss << "Hour:             " << m_i32Hour          << "\n"
       << "Time Past Hour:   " << m_ui32TimePastHour << "\n";

    return ss.str();
}